

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  undefined1 auVar1 [16];
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  double dVar5;
  __time_t _Var6;
  __suseconds_t _Var7;
  int16_t i;
  int iVar8;
  double *x0;
  double *u0;
  double *ret;
  double *p0;
  long lVar9;
  FILE *__stream;
  FILE *__stream_00;
  uint16_t i_1;
  int16_t i_2;
  long lVar10;
  int j;
  timeval tv;
  Cgmres<Model> controller;
  double local_d8;
  timeval local_b8;
  double *local_a8;
  Cgmres<Model> local_a0;
  
  x0 = (double *)operator_new__(0x20);
  u0 = (double *)operator_new__(0x30);
  ret = (double *)operator_new__(0x20);
  p0 = (double *)operator_new__(0x330);
  *x0 = 2.0;
  x0[1] = 2.0;
  x0[2] = 0.0;
  x0[3] = 0.0;
  *u0 = 0.0;
  u0[1] = 0.0;
  u0[2] = 10.0;
  u0[3] = 10.0;
  u0[4] = 0.0005;
  u0[5] = 0.0005;
  ret[2] = 0.0;
  ret[3] = 0.0;
  *ret = 0.0;
  ret[1] = 0.0;
  lVar9 = 0;
  do {
    *(undefined8 *)((long)p0 + lVar9) = 0x3ff0000000000000;
    ((undefined8 *)((long)p0 + lVar9))[1] = 0xbff0000000000000;
    lVar9 = lVar9 + 0x10;
  } while (lVar9 != 0x330);
  Cgmres<Model>::Cgmres(&local_a0);
  lVar9 = 0;
  do {
    local_a0.ptau[lVar9] = p0[lVar9];
    lVar9 = lVar9 + 1;
  } while (lVar9 != 0x66);
  lVar9 = 0;
  do {
    lVar10 = 0;
    do {
      local_a0.U[lVar10] = u0[lVar10];
      lVar10 = lVar10 + 1;
    } while (lVar10 != 6);
    lVar9 = lVar9 + 1;
    local_a0.U = local_a0.U + 6;
  } while (lVar9 != 0x32);
  Cgmres<Model>::init_u0_newton(&local_a0,u0,x0,p0,10);
  __stream = fopen("mass_spring_damper_x.txt","w");
  __stream_00 = fopen("mass_spring_damper_u.txt","w");
  if (__stream_00 != (FILE *)0x0 && __stream != (FILE *)0x0) {
    local_d8 = 0.0;
    iVar8 = 0;
    local_a8 = p0;
    do {
      gettimeofday(&local_b8,(__timezone_ptr_t)0x0);
      _Var7 = local_b8.tv_usec;
      _Var6 = local_b8.tv_sec;
      Cgmres<Model>::control(&local_a0,u0,x0);
      gettimeofday(&local_b8,(__timezone_ptr_t)0x0);
      dVar2 = (double)local_b8.tv_sec;
      dVar5 = (double)local_b8.tv_usec;
      Simulator::dxdt(ret,x0,u0);
      lVar9 = 0;
      do {
        dVar3 = (ret + lVar9)[1] * 0.001;
        auVar1._8_4_ = SUB84(dVar3,0);
        auVar1._0_8_ = ret[lVar9] * 0.001;
        auVar1._12_4_ = (int)((ulong)dVar3 >> 0x20);
        *(undefined1 (*) [16])(ret + lVar9) = auVar1;
        lVar9 = lVar9 + 2;
      } while (lVar9 != 4);
      lVar9 = 0;
      do {
        dVar3 = (ret + lVar9)[1] + (x0 + lVar9)[1];
        auVar4._8_4_ = SUB84(dVar3,0);
        auVar4._0_8_ = ret[lVar9] + x0[lVar9];
        auVar4._12_4_ = (int)((ulong)dVar3 >> 0x20);
        *(undefined1 (*) [16])(x0 + lVar9) = auVar4;
        lVar9 = lVar9 + 2;
      } while (lVar9 != 4);
      fprintf(__stream,"%f");
      fprintf(__stream_00,"%f",SUB84((double)iVar8 * 0.001,0));
      lVar9 = 0;
      do {
        fprintf(__stream,"\t%f",SUB84(x0[lVar9],0));
        lVar9 = lVar9 + 1;
      } while (lVar9 != 4);
      lVar9 = 0;
      do {
        fprintf(__stream_00,"\t%f",SUB84(u0[lVar9],0));
        lVar9 = lVar9 + 1;
      } while (lVar9 != 6);
      local_d8 = local_d8 + ((dVar5 * 1e-06 + dVar2) - ((double)_Var7 * 1e-06 + (double)_Var6));
      fputc(10,__stream);
      fputc(10,__stream_00);
      iVar8 = iVar8 + 1;
    } while (iVar8 != 0x4e21);
    fclose(__stream);
    fclose(__stream_00);
    printf("Elapsed time = %f\n",SUB84(local_d8,0));
    p0 = local_a8;
  }
  operator_delete__(x0);
  operator_delete__(u0);
  operator_delete__(ret);
  operator_delete__(p0);
  Cgmres<Model>::~Cgmres(&local_a0);
  return 0;
}

Assistant:

int main(void) {
  //---------------------------
  FILE* fp_x;
  FILE* fp_u;

  double t_start, t_end, t_all = 0;

  double* x;
  double* u;
  double* dxdt;
  double* pt;

  x = new double[Simulator::dim_x];
  u = new double[Simulator::dim_u];
  dxdt = new double[Simulator::dim_x];
  pt = new double[Simulator::dim_p * (Simulator::dv + 1)];

  // mass_spring_damper
  x[0] = 2.0;
  x[1] = 2.0;
  x[2] = 0.0;
  x[3] = 0.0;

  u[0] = 0.0;
  u[1] = 0.0;
  u[2] = 10.0;
  u[3] = 10.0;
  u[4] = 5e-4;
  u[5] = 5e-4;

  dxdt[0] = 0.0;
  dxdt[1] = 0.0;
  dxdt[2] = 0.0;
  dxdt[3] = 0.0;

  for (int i = 0; i < Simulator::dv + 1; i++) {
    pt[Simulator::dim_p * i + 0] = 1;
    pt[Simulator::dim_p * i + 1] = -1;
  }

  Cgmres<Model> controller;
  controller.set_ptau(pt);
  controller.init_u0(u);
  controller.init_u0_newton(u, x, pt, 10);

  fp_x = fopen("mass_spring_damper_x.txt", "w");
  fp_u = fopen("mass_spring_damper_u.txt", "w");

  if (NULL != fp_x && NULL != fp_u) {
    for (int i = 0; i <= (int)(Simulator::t_end / Simulator::dt); i++) {
      // Test code
      t_start = getEtime();
      controller.control(u, x);
      t_end = getEtime();
      t_all += (t_end - t_start);

      // x = x + dxdt * dt
      Simulator::dxdt(dxdt, x, u);
      mul(dxdt, dxdt, Simulator::dt, Simulator::dim_x);
      add(x, x, dxdt, Simulator::dim_x);

      fprintf(fp_x, "%f", Simulator::dt * i);
      fprintf(fp_u, "%f", Simulator::dt * i);
      for (int j = 0; j < Simulator::dim_x; j++) {
        fprintf(fp_x, "\t%f", x[j]);
      }
      for (int j = 0; j < Simulator::dim_u; j++) {
        fprintf(fp_u, "\t%f", u[j]);
      }
      fprintf(fp_x, "\n");
      fprintf(fp_u, "\n");
    }

    fclose(fp_x);
    fclose(fp_u);

    printf("Elapsed time = %f\n", t_all);
  }

  delete[] x;
  delete[] u;
  delete[] dxdt;
  delete[] pt;

  return 0;
}